

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::output_four_particle_Cn4_correlation(singleParticleSpectra *this)

{
  char *pcVar1;
  size_type sVar2;
  ostream *poVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ofstream output;
  ostringstream filename;
  double local_3e0;
  char *local_3c8;
  char local_3b8 [16];
  long local_3a8;
  filebuf local_3a0 [8];
  undefined8 uStack_398;
  uint auStack_390 [56];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  sVar2 = (this->path_)._M_string_length;
  if (this->rap_type == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cn4",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_eta_",5);
    poVar3 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/particle_",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_Cn4",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_y_",3);
    poVar3 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
  }
  poVar3 = std::ostream::_M_insert<double>(this->rap_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_3a8,local_3c8,_S_out);
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"# n  Cn4  Cn4_err",0x11)
  ;
  std::ios::widen((char)(ostream *)&local_3a8 + (char)*(undefined8 *)(local_3a8 + -0x18));
  std::ostream::put((char)&local_3a8);
  std::ostream::flush();
  dVar6 = (double)this->total_number_of_events;
  dVar7 = *(this->Cn4).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar6;
  dVar5 = *(this->Cn4_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar6 - dVar7 * dVar7;
  local_3e0 = 0.0;
  if (0.0 < dVar5) {
    dVar5 = dVar5 / dVar6;
    if (dVar5 < 0.0) {
      local_3e0 = sqrt(dVar5);
    }
    else {
      local_3e0 = SQRT(dVar5);
    }
  }
  *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) =
       *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)&uStack_398 + *(long *)(local_3a8 + -0x18)) = 0x12;
  *(undefined8 *)(local_3a0 + *(long *)(local_3a8 + -0x18)) = 8;
  poVar3 = (ostream *)std::ostream::operator<<(&local_3a8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
  poVar3 = std::ostream::_M_insert<double>(local_3e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (1 < this->num_Cn4) {
    lVar4 = 1;
    do {
      dVar6 = (double)this->total_number_of_events;
      dVar8 = (this->Cn4).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] / dVar6;
      dVar5 = (this->Cn4_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4] / dVar6 - dVar8 * dVar8;
      local_3e0 = 0.0;
      if (0.0 < dVar5) {
        dVar5 = dVar5 / dVar6;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        local_3e0 = dVar5 / dVar7;
      }
      *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) =
           *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_398 + *(long *)(local_3a8 + -0x18)) = 0x12;
      *(undefined8 *)(local_3a0 + *(long *)(local_3a8 + -0x18)) = 8;
      poVar3 = (ostream *)std::ostream::operator<<(&local_3a8,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(dVar8 / dVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      poVar3 = std::ostream::_M_insert<double>(local_3e0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->num_Cn4);
  }
  local_3a8 = _VTT;
  *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_3a0);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_four_particle_Cn4_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  Cn4  Cn4_err" << endl;
    double num_pair = Cn4[0] / total_number_of_events;
    double num_pair_stdsq =
        (Cn4_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_Cn4; i++) {
        double Cn4_avg = Cn4[i] / total_number_of_events;
        double Cn4_stdsq =
            (Cn4_err[i] / total_number_of_events - Cn4_avg * Cn4_avg);
        Cn4_avg = Cn4_avg / num_pair;
        double Cn4_avg_err = 0.0;
        if (Cn4_stdsq > 0) {
            Cn4_avg_err = sqrt(Cn4_stdsq / total_number_of_events);
            Cn4_avg_err = Cn4_avg_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cn4_avg << "  " << Cn4_avg_err << endl;
    }
}